

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highs_c_api.cpp
# Opt level: O2

HighsInt Highs_runQuiet(void *highs)

{
  HighsStatus HVar1;
  allocator local_4a;
  allocator local_49;
  string local_48;
  string local_28;
  
  std::__cxx11::string::string((string *)&local_48,"Highs_runQuiet",&local_49);
  std::__cxx11::string::string((string *)&local_28,"None",&local_4a);
  Highs::deprecationMessage((Highs *)highs,&local_48,&local_28);
  std::__cxx11::string::~string((string *)&local_28);
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::string((string *)&local_48,"output_flag",(allocator *)&local_28);
  HVar1 = Highs::setOptionValue((Highs *)highs,&local_48,false);
  std::__cxx11::string::~string((string *)&local_48);
  return HVar1;
}

Assistant:

HighsInt Highs_runQuiet(void* highs) {
  ((Highs*)highs)->deprecationMessage("Highs_runQuiet", "None");
  return (HighsInt)((Highs*)highs)->setOptionValue("output_flag", false);
}